

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void removeSpaces(char *str)

{
  int local_18;
  int local_14;
  int i;
  int count;
  char *str_local;
  
  local_14 = 0;
  for (local_18 = 0; str[local_18] != '\0'; local_18 = local_18 + 1) {
    if (str[local_18] != ' ') {
      str[local_14] = str[local_18];
      local_14 = local_14 + 1;
    }
  }
  str[local_14] = '\0';
  return;
}

Assistant:

void removeSpaces(char *str)
{
    // To keep track of non-space character count
    int count = 0;

    // Traverse the given string. If current character
    // is not space, then place it at index 'count++'
    for (int i = 0; str[i]; i++)
        if (str[i] != ' ')
            str[count++] = str[i]; // here count is
                                   // incremented
    str[count] = '\0';
}